

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

result * baryonyx::optimize(result *__return_storage_ptr__,context_ptr *ctx,raw_problem *rawpb)

{
  bool bVar1;
  mode_type mVar2;
  pointer pcVar3;
  type pcVar4;
  type pcVar5;
  problem local_828;
  byte local_729;
  problem local_728;
  byte local_629;
  problem local_628;
  byte local_529;
  problem local_528;
  byte local_429;
  problem local_428;
  byte local_329;
  problem local_328;
  byte local_229;
  problem local_228;
  byte local_119;
  problem local_118;
  raw_problem *local_20;
  raw_problem *rawpb_local;
  context_ptr *ctx_local;
  
  local_20 = rawpb;
  rawpb_local = (raw_problem *)ctx;
  ctx_local = (context_ptr *)__return_storage_ptr__;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)ctx);
  if (bVar1) {
    pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                       ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)rawpb_local)
    ;
    mVar2 = operator&((pcVar3->parameters).mode,branch);
    if (mVar2 == branch) {
      pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                         ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                          rawpb_local);
      local_119 = 0;
      local_229 = 0;
      if ((pcVar3->parameters).preprocessor == all) {
        pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                           ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                            rawpb_local);
        pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                           ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                            rawpb_local);
        preprocess(&local_118,pcVar5,local_20);
        local_119 = 1;
        itm::branch_optimize(__return_storage_ptr__,pcVar4,&local_118);
      }
      else {
        pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                           ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                            rawpb_local);
        pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                           ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                            rawpb_local);
        unpreprocess(&local_228,pcVar5,local_20);
        local_229 = 1;
        itm::branch_optimize(__return_storage_ptr__,pcVar4,&local_228);
      }
      if ((local_229 & 1) != 0) {
        problem::~problem(&local_228);
      }
      if ((local_119 & 1) != 0) {
        problem::~problem(&local_118);
      }
    }
    else {
      pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                         ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                          rawpb_local);
      mVar2 = operator&((pcVar3->parameters).mode,nlopt);
      if (mVar2 == nlopt) {
        pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                           ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                            rawpb_local);
        local_329 = 0;
        local_429 = 0;
        if ((pcVar3->parameters).preprocessor == all) {
          pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                             ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                              rawpb_local);
          pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                             ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                              rawpb_local);
          preprocess(&local_328,pcVar5,local_20);
          local_329 = 1;
          itm::nlopt_optimize(__return_storage_ptr__,pcVar4,&local_328);
        }
        else {
          pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                             ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                              rawpb_local);
          pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                             ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                              rawpb_local);
          unpreprocess(&local_428,pcVar5,local_20);
          local_429 = 1;
          itm::nlopt_optimize(__return_storage_ptr__,pcVar4,&local_428);
        }
        if ((local_429 & 1) != 0) {
          problem::~problem(&local_428);
        }
        if ((local_329 & 1) != 0) {
          problem::~problem(&local_328);
        }
      }
      else {
        pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                           ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                            rawpb_local);
        mVar2 = operator&((pcVar3->parameters).mode,manual);
        if (mVar2 == manual) {
          pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                             ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                              rawpb_local);
          local_529 = 0;
          local_629 = 0;
          if ((pcVar3->parameters).preprocessor == all) {
            pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            preprocess(&local_528,pcVar5,local_20);
            local_529 = 1;
            itm::manual_optimize(__return_storage_ptr__,pcVar4,&local_528);
          }
          else {
            pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            unpreprocess(&local_628,pcVar5,local_20);
            local_629 = 1;
            itm::manual_optimize(__return_storage_ptr__,pcVar4,&local_628);
          }
          if ((local_629 & 1) != 0) {
            problem::~problem(&local_628);
          }
          if ((local_529 & 1) != 0) {
            problem::~problem(&local_528);
          }
        }
        else {
          pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                             ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                              rawpb_local);
          local_729 = 0;
          if ((pcVar3->parameters).preprocessor == all) {
            pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            preprocess(&local_728,pcVar5,local_20);
            local_729 = 1;
            itm::optimize(__return_storage_ptr__,pcVar4,&local_728);
          }
          else {
            pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            pcVar5 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                               ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                                rawpb_local);
            unpreprocess(&local_828,pcVar5,local_20);
            itm::optimize(__return_storage_ptr__,pcVar4,&local_828);
            problem::~problem(&local_828);
          }
          if ((local_729 & 1) != 0) {
            problem::~problem(&local_728);
          }
        }
      }
    }
  }
  else {
    result::result(__return_storage_ptr__,empty_context);
  }
  return __return_storage_ptr__;
}

Assistant:

result
optimize(const baryonyx::context_ptr& ctx, const raw_problem& rawpb)
{
    if (ctx) {
        if ((ctx->parameters.mode & solver_parameters::mode_type::branch) ==
            solver_parameters::mode_type::branch)
            return (ctx->parameters.preprocessor ==
                    solver_parameters::preprocessor_options::all)
                     ? itm::branch_optimize(*ctx, preprocess(*ctx, rawpb))
                     : itm::branch_optimize(*ctx, unpreprocess(*ctx, rawpb));

        if ((ctx->parameters.mode & solver_parameters::mode_type::nlopt) ==
            solver_parameters::mode_type::nlopt)
            return (ctx->parameters.preprocessor ==
                    solver_parameters::preprocessor_options::all)
                     ? itm::nlopt_optimize(*ctx, preprocess(*ctx, rawpb))
                     : itm::nlopt_optimize(*ctx, unpreprocess(*ctx, rawpb));

        if ((ctx->parameters.mode & solver_parameters::mode_type::manual) ==
            solver_parameters::mode_type::manual)
            return (ctx->parameters.preprocessor ==
                    solver_parameters::preprocessor_options::all)
                     ? itm::manual_optimize(*ctx, preprocess(*ctx, rawpb))
                     : itm::manual_optimize(*ctx, unpreprocess(*ctx, rawpb));

        return (ctx->parameters.preprocessor ==
                solver_parameters::preprocessor_options::all)
                 ? itm::optimize(*ctx, preprocess(*ctx, rawpb))
                 : itm::optimize(*ctx, unpreprocess(*ctx, rawpb));
    }

    return result{ baryonyx::result_status::empty_context };
}